

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interactive.cpp
# Opt level: O0

int MainLoop(Sudoku *s)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  char *__nptr;
  int i;
  undefined1 local_40 [8];
  string prikaz;
  int y;
  int x;
  Sudoku *s_local;
  
  prikaz.field_2._12_4_ = 4;
  prikaz.field_2._8_4_ = 4;
  printS(s,4,4);
  poVar3 = std::operator<<((ostream *)&std::cout,"Pro ziskani napovedy pouzijte prikaz \'help\'.");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  printPrompt();
  do {
    std::__cxx11::string::string((string *)local_40);
    std::operator>>((istream *)&std::cin,(string *)local_40);
    std::ios::clear((long)&std::cin + *(long *)(std::cin + -0x18),0);
    std::istream::ignore((long)&std::cin,1000);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_40,"help");
    if (bVar1) {
      printHelp();
      printPrompt();
LAB_00109375:
      bVar1 = false;
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_40,"print");
      if (bVar1) {
        printS(s,prikaz.field_2._12_4_,prikaz.field_2._8_4_);
        printPrompt();
        goto LAB_00109375;
      }
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_40,"solve");
      if (bVar1) {
        iVar2 = Sudoku::rekurzivniReseni(s);
        if (iVar2 == 0) {
          poVar3 = std::operator<<((ostream *)&std::cout,"Neco je velmi spatne...");
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        }
        printVitezstvi(s);
        printS(s,prikaz.field_2._12_4_,prikaz.field_2._8_4_);
        printPrompt();
        goto LAB_00109375;
      }
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_40,"rsolve");
      if (bVar1) {
        Sudoku::restart(s);
        iVar2 = Sudoku::rekurzivniReseni(s);
        if (iVar2 == 0) {
          poVar3 = std::operator<<((ostream *)&std::cout,"Neco je velmi spatne...");
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        }
        printVitezstvi(s);
        printS(s,prikaz.field_2._12_4_,prikaz.field_2._8_4_);
        printPrompt();
        goto LAB_00109375;
      }
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_40,"w");
      if (bVar1) {
        iVar2 = prikaz.field_2._8_4_ + -1;
        if (prikaz.field_2._8_4_ + -1 < 0) {
          iVar2 = prikaz.field_2._8_4_ + 8;
        }
        prikaz.field_2._8_4_ = iVar2;
        printS(s,prikaz.field_2._12_4_,prikaz.field_2._8_4_);
        printPrompt();
        goto LAB_00109375;
      }
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_40,"s");
      if (bVar1) {
        iVar2 = prikaz.field_2._8_4_ + 1;
        if (8 < prikaz.field_2._8_4_ + 1) {
          iVar2 = prikaz.field_2._8_4_ + -8;
        }
        prikaz.field_2._8_4_ = iVar2;
        printS(s,prikaz.field_2._12_4_,prikaz.field_2._8_4_);
        printPrompt();
        goto LAB_00109375;
      }
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_40,"a");
      if (bVar1) {
        iVar2 = prikaz.field_2._12_4_ + -1;
        if (prikaz.field_2._12_4_ + -1 < 0) {
          iVar2 = prikaz.field_2._12_4_ + 8;
        }
        prikaz.field_2._12_4_ = iVar2;
        printS(s,prikaz.field_2._12_4_,prikaz.field_2._8_4_);
        printPrompt();
        goto LAB_00109375;
      }
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_40,"d");
      if (bVar1) {
        iVar2 = prikaz.field_2._12_4_ + 1;
        if (8 < prikaz.field_2._12_4_ + 1) {
          iVar2 = prikaz.field_2._12_4_ + -8;
        }
        prikaz.field_2._12_4_ = iVar2;
        printS(s,prikaz.field_2._12_4_,prikaz.field_2._8_4_);
        printPrompt();
        goto LAB_00109375;
      }
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_40,".");
      if (((bVar1) ||
          (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_40,"x"), bVar1)) ||
         (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_40,"0"), bVar1)) {
        Sudoku::smazat(s,prikaz.field_2._12_4_,prikaz.field_2._8_4_);
        printS(s,prikaz.field_2._12_4_,prikaz.field_2._8_4_);
        printPrompt();
        goto LAB_00109375;
      }
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_40,"1");
      if (((((bVar1) ||
            (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_40,"2"), bVar1)) ||
           ((bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_40,"3"), bVar1 ||
            ((bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_40,"4"), bVar1 ||
             (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_40,"5"), bVar1)))))) ||
          (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_40,"6"), bVar1)) ||
         (((bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_40,"7"), bVar1 ||
           (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_40,"8"), bVar1)) ||
          (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_40,"9"), bVar1)))) {
        __nptr = (char *)std::__cxx11::string::c_str();
        iVar2 = atoi(__nptr);
        Sudoku::doplnM(s,prikaz.field_2._12_4_,prikaz.field_2._8_4_,iVar2);
        printS(s,prikaz.field_2._12_4_,prikaz.field_2._8_4_);
        printVitezstvi(s);
        printPrompt();
        goto LAB_00109375;
      }
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_40,"exit");
      if (!bVar1) {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_40,"reset");
        if (bVar1) {
          Sudoku::restart(s);
          printS(s,prikaz.field_2._12_4_,prikaz.field_2._8_4_);
          printPrompt();
        }
        else {
          printHelp();
          printPrompt();
        }
        goto LAB_00109375;
      }
      std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
      s_local._4_4_ = 0;
      bVar1 = true;
    }
    std::__cxx11::string::~string((string *)local_40);
    if (bVar1) {
      return s_local._4_4_;
    }
  } while( true );
}

Assistant:

int MainLoop ( Sudoku * s )
{
  int x = 4,y = 4; // nastavime kurzor doprostred pole
  printS(s,x,y);
  cout << "Pro ziskani napovedy pouzijte prikaz 'help'." << endl;
  printPrompt();
  while (true)
  {
    string prikaz;
    cin >> prikaz;
    cin.clear();
    cin.ignore(1000, '\n');
    if ( prikaz == "help")
    {
      printHelp();
      printPrompt();
    }
    else if (prikaz == "print")
    {
      printS(s,x,y);
      printPrompt();
    }
    else if (prikaz == "solve")
    {
      if (!s->rekurzivniReseni())
        cout << "Neco je velmi spatne..." << endl;
      printVitezstvi(s);
      printS(s,x,y);
      printPrompt();
    }
    else if (prikaz == "rsolve")
    {
      s->restart();
      if (!s->rekurzivniReseni())
        cout << "Neco je velmi spatne..." << endl;
      printVitezstvi(s);
      printS(s,x,y);
      printPrompt();
    }
    else if (prikaz == "w")
    {
      y--;
      if (y < 0) y+=9;
      printS(s,x,y);
      printPrompt();
    }
    else if (prikaz == "s")
    {
      y++;
      if (y > 8) y-=9;
      printS(s,x,y);
      printPrompt();
    }
    else if (prikaz == "a")
    {
      x--;
      if (x < 0) x+=9;
      printS(s,x,y);
      printPrompt();
    }
    else if (prikaz == "d")
    {
      x++;
      if (x > 8) x-=9;
      printS(s,x,y);
      printPrompt();
    }
    // mazani cisla
    else if (prikaz == "." || prikaz == "x" || prikaz == "0")
    {
      s->smazat(x,y);
      printS(s,x,y);
      printPrompt();
    }
    // doplnovani cisla
    else if(prikaz == "1" || prikaz == "2" || prikaz == "3" || prikaz == "4" || prikaz == "5" || prikaz == "6" || prikaz == "7" || prikaz == "8" || prikaz == "9")
    {
      int i = atoi(prikaz.c_str());
      s->doplnM(x,y,i);
      printS(s,x,y);
      printVitezstvi(s);
      printPrompt();
    }
    else if(prikaz == "exit")
    {
      cout << endl;
      return 0;
    }
    else if(prikaz == "reset")
    {
      s->restart();
      printS(s,x,y);
      printPrompt();
    }
    else
    {
      printHelp();
      printPrompt();
    }
  }
  return 0;
}